

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboColorbufferTests.cpp
# Opt level: O0

Vec4 __thiscall deqp::gles31::Functional::generateRandomColor(Functional *this,Random *random)

{
  float *pfVar1;
  float fVar2;
  undefined8 in_XMM1_Qa;
  Vec4 VVar3;
  Random *random_local;
  Vec4 *retVal;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this);
  fVar2 = de::Random::getFloat(random);
  pfVar1 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)this,0);
  *pfVar1 = fVar2;
  fVar2 = de::Random::getFloat(random);
  pfVar1 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)this,1);
  *pfVar1 = fVar2;
  fVar2 = de::Random::getFloat(random);
  pfVar1 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)this,2);
  *pfVar1 = fVar2;
  pfVar1 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)this,3);
  *pfVar1 = 1.0;
  VVar3.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar3.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  VVar3.m_data[0] = 1.0;
  VVar3.m_data[1] = 0.0;
  return (Vec4)VVar3.m_data;
}

Assistant:

static tcu::Vec4 generateRandomColor (de::Random& random)
{
	tcu::Vec4 retVal;

	retVal[0] = random.getFloat();
	retVal[1] = random.getFloat();
	retVal[2] = random.getFloat();
	retVal[3] = 1.0f;

	return retVal;
}